

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

void Seg_ManCreateCnf(Seg_Man_t *p,int fTwo,int fVerbose)

{
  Gia_Man_t *p_00;
  void *__ptr;
  Seg_Man_t *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  undefined4 extraout_var;
  int *piVar8;
  Vec_Int_t *pVVar9;
  abctime aVar10;
  abctime time;
  long lVar11;
  char *pStr;
  int Var;
  Tim_Man_t *pTVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  int pLits [3];
  int local_88;
  int local_84;
  Vec_Wec_t *local_80;
  int local_74;
  Tim_Man_t *local_70;
  Seg_Man_t *local_68;
  undefined8 local_60;
  int local_54;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  abctime local_38;
  
  pTVar12 = (Tim_Man_t *)p->pGia->pManTime;
  local_54 = fVerbose;
  local_40 = fTwo;
  local_38 = Abc_Clock();
  local_44 = sat_solver_nclauses(p->pSat);
  local_84 = 0;
  iVar3 = 0;
  local_70 = pTVar12;
  local_68 = p;
  while( true ) {
    if ((p->pGia->nObjs <= iVar3) ||
       (pGVar7 = Gia_ManObj(p->pGia,iVar3), pGVar7 == (Gia_Obj_t *)0x0)) break;
    iVar2 = Vec_IntEntry(p->vFirsts,iVar3);
    local_80 = (Vec_Wec_t *)CONCAT44(local_80._4_4_,iVar2);
    local_74 = Vec_IntEntry(p->vNvars,iVar3);
    if ((pTVar12 == (Tim_Man_t *)0x0) ||
       (((undefined1  [12])*pGVar7 & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff))
    {
      iVar2 = Gia_ObjIsLut(p->pGia,iVar3);
      if (iVar2 != 0) {
        local_3c = (int)local_80 + 1;
        lVar11 = 0;
        local_88 = iVar3;
        while( true ) {
          iVar3 = local_88;
          iVar2 = Gia_ObjLutSize(p->pGia,local_88);
          pTVar12 = local_70;
          if (iVar2 <= lVar11) break;
          piVar8 = Gia_ObjLutFanins(p->pGia,iVar3);
          iVar3 = piVar8[lVar11];
          local_50 = lVar11;
          if ((local_70 == (Tim_Man_t *)0x0) ||
             (pGVar7 = Gia_ManObj(p->pGia,iVar3),
             ((undefined1  [12])*pGVar7 & (undefined1  [12])0x9fffffff) !=
             (undefined1  [12])0x9fffffff)) {
            pGVar7 = Gia_ManObj(p->pGia,iVar3);
            if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
              iVar4 = Vec_IntEntry(p->vFirsts,iVar3);
              iVar3 = Vec_IntEntry(p->vNvars,iVar3);
              iVar2 = local_84;
              if ((iVar3 == 1) || (local_74 <= iVar3)) {
                __assert_fail("nVars != 1 && nVars < nVarsLut",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x138,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
              if (iVar3 == 0) {
                pLits[0] = Abc_Var2Lit(local_84,1);
                pLits[1] = Abc_Var2Lit((int)local_80,0);
                pSVar1 = local_68;
                iVar5 = sat_solver_addclause(local_68->pSat,pLits,pLits + 2);
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x13f,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                pLits[0] = Abc_Var2Lit(iVar2,0);
                pLits[1] = Abc_Var2Lit(local_3c,0);
                iVar2 = sat_solver_addclause(pSVar1->pSat,pLits,pLits + 2);
                if (iVar2 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x144,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
              if (iVar3 < 1) {
                iVar3 = 0;
              }
              iVar2 = (int)local_80;
              while (iVar3 != 0) {
                local_60 = CONCAT44(local_60._4_4_,iVar3 + -1);
                pLits[0] = Abc_Var2Lit(iVar4,1);
                iVar3 = local_84;
                pLits[1] = Abc_Var2Lit(local_84,1);
                pLits[2] = Abc_Var2Lit(iVar2,0);
                pSVar1 = local_68;
                iVar5 = sat_solver_addclause(local_68->pSat,pLits,&local_88);
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x14d,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                pLits[0] = Abc_Var2Lit(iVar4,1);
                pLits[1] = Abc_Var2Lit(iVar3,0);
                iVar2 = iVar2 + 1;
                pLits[2] = Abc_Var2Lit(iVar2,0);
                iVar5 = sat_solver_addclause(pSVar1->pSat,pLits,&local_88);
                iVar4 = iVar4 + 1;
                iVar3 = (int)local_60;
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x153,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
              local_84 = local_84 + 1;
              p = local_68;
            }
          }
          else {
            iVar2 = Vec_IntEntry(p->vFirsts,iVar3);
            iVar3 = Vec_IntEntry(p->vNvars,iVar3);
            if (local_74 < iVar3) {
              __assert_fail("nVars <= nVarsLut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                            ,0x128,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
            }
            if (0 < iVar3) {
              iVar4 = (int)local_80;
              while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
                pLits[0] = Abc_Var2Lit(iVar2,1);
                pLits[1] = Abc_Var2Lit(iVar4,0);
                iVar5 = sat_solver_addclause(p->pSat,pLits,pLits + 2);
                iVar2 = iVar2 + 1;
                iVar4 = iVar4 + 1;
                if (iVar5 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x130,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
              }
            }
          }
          lVar11 = local_50 + 1;
        }
      }
    }
    else {
      local_88 = iVar3;
      iVar3 = Gia_ObjCioId(pGVar7);
      iVar2 = Tim_ManBoxForCi(pTVar12,iVar3);
      iVar3 = local_88;
      if ((0 < local_74) && (-1 < iVar2)) {
        iVar3 = Tim_ManBoxOutputFirst(pTVar12,iVar2);
        iVar4 = Gia_ObjCioId(pGVar7);
        pTVar12 = local_70;
        if (iVar3 == iVar4) {
          iVar4 = Tim_ManBoxInputNum(local_70,iVar2);
          iVar3 = Tim_ManBoxInputFirst(pTVar12,iVar2);
          local_60 = CONCAT44(extraout_var,iVar3);
          local_80 = (Vec_Wec_t *)CONCAT44(local_80._4_4_,(int)local_80 + 1);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          for (iVar2 = 0; pSVar1 = local_68, pTVar12 = local_70, p = local_68, iVar3 = local_88,
              iVar2 != iVar4 + -1; iVar2 = iVar2 + 1) {
            pGVar7 = Gia_ManCo(local_68->pGia,iVar2 + (int)local_60);
            iVar3 = Gia_ObjId(pSVar1->pGia,pGVar7);
            iVar3 = iVar3 - (*(uint *)pGVar7 & 0x1fffffff);
            iVar5 = Vec_IntEntry(pSVar1->vFirsts,iVar3);
            iVar3 = Vec_IntEntry(pSVar1->vNvars,iVar3);
            if (local_74 <= iVar3) {
              __assert_fail("nVars < nVarsLut",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                            ,0x101,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
            }
            if (iVar3 < 1) {
              iVar3 = 0;
            }
            Var = (int)local_80;
            while (bVar15 = iVar3 != 0, iVar3 = iVar3 + -1, bVar15) {
              pLits[0] = Abc_Var2Lit(iVar5,1);
              pLits[1] = Abc_Var2Lit(Var,0);
              iVar6 = sat_solver_addclause(local_68->pSat,pLits,pLits + 2);
              Var = Var + 1;
              iVar5 = iVar5 + 1;
              if (iVar6 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x108,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
          }
        }
        else {
          p_00 = p->pGia;
          iVar3 = Vec_IntEntry(p_00->vCis,iVar3);
          pGVar7 = Gia_ManObj(p_00,iVar3);
          iVar3 = Gia_ObjId(p->pGia,pGVar7);
          iVar2 = Vec_IntEntry(p->vFirsts,iVar3);
          iVar4 = Vec_IntEntry(p->vNvars,iVar3);
          pTVar12 = local_70;
          iVar3 = local_88;
          if (0 < iVar4) {
            while (bVar15 = iVar4 != 0, iVar4 = iVar4 + -1, pTVar12 = local_70, iVar3 = local_88,
                  bVar15) {
              pLits[0] = Abc_Var2Lit(iVar2,1);
              iVar3 = (int)local_80;
              pLits[1] = Abc_Var2Lit((int)local_80,0);
              iVar5 = sat_solver_addclause(p->pSat,pLits,pLits + 2);
              iVar2 = iVar2 + 1;
              local_80 = (Vec_Wec_t *)CONCAT44(local_80._4_4_,iVar3 + 1);
              if (iVar5 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x11a,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
          }
        }
      }
    }
    iVar3 = iVar3 + 1;
  }
  if (local_84 != p->nVars) {
    __assert_fail("Count == p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                  ,0x158,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
  }
  if (local_54 != 0) {
    iVar3 = sat_solver_nclauses(p->pSat);
    printf("Delay constraints = %d. ",(ulong)(uint)(iVar3 - local_44));
  }
  iVar3 = sat_solver_nclauses(p->pSat);
  local_70 = (Tim_Man_t *)CONCAT44(local_70._4_4_,iVar3);
  local_80 = Seg_ManCollectObjEdges(p->vEdges,p->pGia->nObjs);
  local_88 = local_80->nSize;
  iVar3 = 0;
  if (local_88 < 1) {
    local_88 = 0;
  }
  do {
    if (iVar3 == local_88) {
      pVVar9 = local_80->pArray;
      uVar14 = 0;
      uVar13 = (ulong)(uint)local_80->nCap;
      if (local_80->nCap < 1) {
        uVar13 = uVar14;
      }
      for (; uVar13 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
        __ptr = *(void **)((long)&pVVar9->pArray + uVar14);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar9->pArray + uVar14) = 0;
        }
      }
      free(pVVar9);
      free(local_80);
      pSVar1 = local_68;
      iVar3 = 0;
      do {
        if (pSVar1->vToSkip->nSize <= iVar3) {
          if (local_54 != 0) {
            iVar3 = sat_solver_nclauses(pSVar1->pSat);
            pStr = (char *)(ulong)(uint)(iVar3 - (int)local_70);
            printf("Edge constraints = %d. ");
            aVar10 = Abc_Clock();
            Abc_PrintTime((int)aVar10 - (int)local_38,pStr,time);
          }
          return;
        }
        iVar2 = Vec_IntEntry(pSVar1->vToSkip,iVar3);
        pLits[0] = Abc_Var2Lit(iVar2,1);
        iVar2 = sat_solver_addclause(pSVar1->pSat,pLits,pLits + 1);
        iVar3 = iVar3 + 1;
      } while (iVar2 != 0);
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                    ,399,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
    }
    local_50 = CONCAT44(local_50._4_4_,iVar3);
    pVVar9 = Vec_WecEntry(local_80,iVar3);
    iVar3 = pVVar9->nSize;
    if (local_40 == 0) {
      if (1 < iVar3) goto LAB_006287bc;
    }
    else if (iVar3 < 0xb) {
      if (2 < iVar3) {
        iVar2 = 0;
        while (iVar2 < iVar3) {
          iVar5 = Vec_IntEntry(pVVar9,iVar2);
          iVar3 = pVVar9->nSize;
          local_84 = iVar2 + 1;
          iVar4 = local_84;
          while (iVar2 = local_84, iVar4 < iVar3) {
            iVar2 = Vec_IntEntry(pVVar9,iVar4);
            iVar4 = iVar4 + 1;
            local_60 = CONCAT44(local_60._4_4_,iVar4);
            while (iVar3 = pVVar9->nSize, iVar4 < iVar3) {
              iVar3 = Vec_IntEntry(pVVar9,iVar4);
              pLits[0] = Abc_Var2Lit(iVar5,1);
              pLits[1] = Abc_Var2Lit(iVar2,1);
              p = local_68;
              pLits[2] = Abc_Var2Lit(iVar3,1);
              iVar3 = sat_solver_addclause(p->pSat,pLits,&local_88);
              iVar4 = iVar4 + 1;
              if (iVar3 == 0) {
                __assert_fail("value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x185,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
            }
            iVar4 = (int)local_60;
          }
        }
      }
    }
    else {
LAB_006287bc:
      iVar2 = 0;
      while (iVar2 < iVar3) {
        iVar4 = Vec_IntEntry(pVVar9,iVar2);
        iVar2 = iVar2 + 1;
        local_60 = CONCAT44(local_60._4_4_,iVar2);
        while (iVar3 = pVVar9->nSize, iVar2 < iVar3) {
          iVar3 = Vec_IntEntry(pVVar9,iVar2);
          pLits[0] = Abc_Var2Lit(iVar4,1);
          pLits[1] = Abc_Var2Lit(iVar3,1);
          iVar3 = sat_solver_addclause(p->pSat,pLits,pLits + 2);
          iVar2 = iVar2 + 1;
          if (iVar3 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                          ,0x178,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
          }
        }
        iVar2 = (int)local_60;
      }
    }
    iVar3 = (int)local_50 + 1;
  } while( true );
}

Assistant:

void Seg_ManCreateCnf( Seg_Man_t * p, int fTwo, int fVerbose )
{
    Tim_Man_t * pTim = (Tim_Man_t *)p->pGia->pManTime;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vObjEdges;
    Vec_Int_t * vLevel;
    int iLut, iFanin, iFirst;
    int pLits[3], Count = 0;
    int i, k, nVars, Edge, value;
    abctime clk = Abc_Clock();
    // edge delay constraints
    int nConstr = sat_solver_nclauses(p->pSat);
    Gia_ManForEachObj( p->pGia, pObj, iLut )
    {
        int iFirstLut = Vec_IntEntry( p->vFirsts, iLut );
        int nVarsLut  = Vec_IntEntry( p->vNvars, iLut );
        if ( pTim && Gia_ObjIsCi(pObj) )
        {
            int iBox = Tim_ManBoxForCi( pTim, Gia_ObjCioId(pObj) );
            if ( nVarsLut > 0 && iBox >= 0 )
            {
                int iCiId = Tim_ManBoxOutputFirst( pTim, iBox );
                if ( iCiId == Gia_ObjCioId(pObj) ) // first input
                {
                    int nIns = Tim_ManBoxInputNum( pTim, iBox );
                    int iIn0 = Tim_ManBoxInputFirst( pTim, iBox );
                    for ( i = 0; i < nIns-1; i++ ) // skip carry-in pin
                    {
                        Gia_Obj_t * pOut = Gia_ManCo( p->pGia, iIn0+i );
                        int iDriverId = Gia_ObjFaninId0p( p->pGia, pOut );
                        int AddOn;

                        iFirst = Vec_IntEntry( p->vFirsts, iDriverId );
                        nVars  = Vec_IntEntry( p->vNvars, iDriverId );
                        assert( nVars < nVarsLut );
                        AddOn = (int)(nVars < nVarsLut);
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k+AddOn, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
                else // intermediate input
                {
                    Gia_Obj_t * pIn = Gia_ManCi( p->pGia, iCiId );
                    int iObjId = Gia_ObjId( p->pGia, pIn );

                    iFirst = Vec_IntEntry( p->vFirsts, iObjId );
                    nVars  = Vec_IntEntry( p->vNvars, iObjId );
                    if ( nVars > 0 )
                    {
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
            }
            continue;
        }
        if ( !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        Gia_LutForEachFanin( p->pGia, iLut, iFanin, i )
            if ( pTim && Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars <= nVarsLut );
                if ( nVars > 0 )
                {
                    for ( k = 0; k < nVars; k++ )
                    {
                        pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                        pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                        value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                        assert( value );
                    }
                }
            }
            else if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars != 1 && nVars < nVarsLut );
                // add initial
                if ( nVars == 0 )
                {
                    pLits[0] = Abc_Var2Lit( Count, 1 );
                    pLits[1] = Abc_Var2Lit( iFirstLut, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( Count, 0 );
                    pLits[1] = Abc_Var2Lit( iFirstLut+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );
                }
                // add others
                for ( k = 0; k < nVars; k++ )
                {
                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 1 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 0 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );
                }
                Count++;
            }
    }
    assert( Count == p->nVars );
    if ( fVerbose )
    printf( "Delay constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    nConstr = sat_solver_nclauses(p->pSat);
/*
    // delay relationship constraints
    Vec_IntForEachEntryTwo( p->vFirsts, p->vNvars, iFirst, nVars, iLut )
    {
        if ( nVars < 2 )
            continue;
        for ( i = 1; i < nVars; i++ )
        {
            pLits[0] = Abc_Var2Lit( iFirst + i - 1, 1 );
            pLits[1] = Abc_Var2Lit( iFirst + i,     0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
            assert( value );
        }
    }
*/
    // edge compatibility constraint
    vObjEdges = Seg_ManCollectObjEdges( p->vEdges, Gia_ManObjNum(p->pGia) );
    Vec_WecForEachLevel( vObjEdges, vLevel, i )
    {
        int v1, v2, v3, Var1, Var2, Var3;
        if ( (!fTwo && Vec_IntSize(vLevel) >= 2) || (fTwo && Vec_IntSize(vLevel) > 10) )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                assert( value );
            }
        }
        else if ( fTwo && Vec_IntSize(vLevel) >= 3 )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            Vec_IntForEachEntryStart( vLevel, Var3, v3, v2 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                pLits[2] = Abc_Var2Lit( Var3, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                assert( value );
            }
        }
    }
    Vec_WecFree( vObjEdges );
    // block forbidden edges
    Vec_IntForEachEntry( p->vToSkip, Edge, i )
    {
        pLits[0] = Abc_Var2Lit( Edge, 1 );
        value = sat_solver_addclause( p->pSat, pLits, pLits+1 );
        assert( value );
    }
    if ( fVerbose )
    printf( "Edge constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}